

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O3

int blake2b_final(blake2b_state *S,void *out,size_t outlen)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  uint64_t uStack_30;
  
  iVar5 = -1;
  if (((out != (void *)0x0 && S != (blake2b_state *)0x0) && (S->outlen <= outlen)) && (S->f[0] == 0)
     ) {
    uVar3 = S->buflen;
    uVar4 = (ulong)uVar3;
    puVar1 = S->t;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 + uVar4;
    S->t[1] = S->t[1] + (ulong)CARRY8(uVar2,uVar4);
    if (S->last_node != '\0') {
      S->f[1] = 0xffffffffffffffff;
    }
    S->f[0] = 0xffffffffffffffff;
    iVar5 = 0;
    memset(S->buf + uVar4,0,(ulong)(0x80 - uVar3));
    blake2b_compress(S,S->buf);
    local_68 = S->h[0];
    uStack_60 = S->h[1];
    local_58 = S->h[2];
    uStack_50 = S->h[3];
    local_48 = S->h[4];
    uStack_40 = S->h[5];
    local_38 = S->h[6];
    uStack_30 = S->h[7];
    memcpy(out,&local_68,(ulong)S->outlen);
  }
  return iVar5;
}

Assistant:

int blake2b_final(blake2b_state *S, void *out, size_t outlen) {
	uint8_t buffer[BLAKE2B_OUTBYTES] = { 0 };
	unsigned int i;

	/* Sanity checks */
	if (S == NULL || out == NULL || outlen < S->outlen) {
		return -1;
	}

	/* Is this a reused state? */
	if (S->f[0] != 0) {
		return -1;
	}

	blake2b_increment_counter(S, S->buflen);
	blake2b_set_lastblock(S);
	memset(&S->buf[S->buflen], 0, BLAKE2B_BLOCKBYTES - S->buflen); /* Padding */
	blake2b_compress(S, S->buf);

	for (i = 0; i < 8; ++i) { /* Output full hash to temp buffer */
		store64(buffer + sizeof(S->h[i]) * i, S->h[i]);
	}

	memcpy(out, buffer, S->outlen);
	//clear_internal_memory(buffer, sizeof(buffer));
	//clear_internal_memory(S->buf, sizeof(S->buf));
	//clear_internal_memory(S->h, sizeof(S->h));
	return 0;
}